

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtree.cpp
# Opt level: O1

vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> * __thiscall
libDAI::JTree::beliefs
          (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
           *__return_storage_ptr__,JTree *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t alpha;
  size_t beta;
  ulong uVar2;
  long lVar3;
  
  (__return_storage_ptr__->
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = 0;
  uVar2 = 0;
  while( true ) {
    iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    if ((ulong)((*(long *)(CONCAT44(extraout_var,iVar1) + 0x100) -
                 *(long *)(CONCAT44(extraout_var,iVar1) + 0xf8) >> 3) * -0x3333333333333333) <=
        uVar2) break;
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              (__return_storage_ptr__,
               (value_type *)
               ((long)&(((this->_Qb).
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar3));
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x38;
  }
  lVar3 = 0;
  uVar2 = 0;
  while( true ) {
    iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    if ((ulong)(*(long *)(CONCAT44(extraout_var_00,iVar1) + 0xe8) -
                *(long *)(CONCAT44(extraout_var_00,iVar1) + 0xe0) >> 6) <= uVar2) break;
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              (__return_storage_ptr__,
               (value_type *)
               ((long)&(((this->_Qa).
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar3));
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x38;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Factor> JTree::beliefs() const {
        vector<Factor> result;
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            result.push_back( _Qb[beta] );
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            result.push_back( _Qa[alpha] );
        return result;
    }